

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_quote(connectdata *conn,_Bool init,ftpstate instate)

{
  Curl_easy *data_00;
  void *pvVar1;
  bool bVar2;
  CURLcode CVar3;
  anon_union_240_10_26c073a1_for_proto *pp;
  char *local_60;
  char *cmd;
  curl_slist *pcStack_50;
  int i;
  curl_slist *item;
  _Bool quote;
  ftp_conn *ftpc;
  FTP *ftp;
  Curl_easy *data;
  CURLcode result;
  ftpstate instate_local;
  _Bool init_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  pp = &conn->proto;
  bVar2 = false;
  if (instate != FTP_QUOTE) {
    if (instate - FTP_RETR_PREQUOTE < 2) {
      pcStack_50 = (data_00->set).prequote;
      goto LAB_0011e921;
    }
    if (instate == FTP_POSTQUOTE) {
      pcStack_50 = (data_00->set).postquote;
      goto LAB_0011e921;
    }
  }
  pcStack_50 = (data_00->set).quote;
LAB_0011e921:
  if (init) {
    (conn->proto).ftpc.count1 = 0;
  }
  else {
    (conn->proto).ftpc.count1 = (conn->proto).ftpc.count1 + 1;
  }
  if (pcStack_50 != (curl_slist *)0x0) {
    for (cmd._4_4_ = 0; cmd._4_4_ < (conn->proto).ftpc.count1 && pcStack_50 != (curl_slist *)0x0;
        cmd._4_4_ = cmd._4_4_ + 1) {
      pcStack_50 = pcStack_50->next;
    }
    if (pcStack_50 != (curl_slist *)0x0) {
      local_60 = pcStack_50->data;
      if (*local_60 == '*') {
        local_60 = local_60 + 1;
        (conn->proto).ftpc.count2 = 1;
      }
      else {
        (conn->proto).ftpc.count2 = 0;
      }
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",local_60);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      _state(conn,instate);
      bVar2 = true;
    }
  }
  data._4_4_ = CURLE_OK;
  if (!bVar2) {
    switch(instate) {
    case FTP_QUOTE:
    default:
      data._4_4_ = ftp_state_cwd(conn);
      break;
    case FTP_RETR_PREQUOTE:
      if (*(int *)((long)pvVar1 + 0x28) == 0) {
        if ((conn->proto).ftpc.known_filesize == -1) {
          if (((data_00->set).ignorecl & 1U) == 0) {
            CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"SIZE %s",(conn->proto).ftpc.file);
            if (CVar3 != CURLE_OK) {
              return CVar3;
            }
            _state(conn,FTP_RETR_SIZE);
            data._4_4_ = CURLE_OK;
          }
          else {
            CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
            if (CVar3 != CURLE_OK) {
              return CVar3;
            }
            _state(conn,FTP_RETR);
            data._4_4_ = CURLE_OK;
          }
        }
        else {
          Curl_pgrsSetDownloadSize(data_00,(conn->proto).ftpc.known_filesize);
          data._4_4_ = ftp_state_retr(conn,(conn->proto).ftpc.known_filesize);
        }
      }
      else {
        _state(conn,FTP_STOP);
      }
      break;
    case FTP_STOR_PREQUOTE:
      data._4_4_ = ftp_state_ul_setup(conn,false);
      break;
    case FTP_POSTQUOTE:
    }
  }
  return data._4_4_;
}

Assistant:

static CURLcode ftp_state_quote(struct connectdata *conn,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      PPSENDF(&ftpc->pp, "%s", cmd);
      state(conn, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != FTPTRANSFER_BODY)
        state(conn, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(conn, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl) {
            /* This code is to support download of growing files.  It prevents
               the state machine from requesting the file size from the
               server.  With an unknown file size the download continues until
               the server terminates it, otherwise the client stops if the
               received byte count exceeds the reported file size.  Set option
               CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this behavior.*/
            PPSENDF(&ftpc->pp, "RETR %s", ftpc->file);
            state(conn, FTP_RETR);
          }
          else {
            PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
            state(conn, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(conn, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}